

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp-bare.c
# Opt level: O2

void ssh2_bare_bpp_handle_input(BinaryPacketProtocol *bpp)

{
  byte bVar1;
  int iVar2;
  LogContext *ctx;
  long lVar3;
  void *pvVar4;
  _Bool _Var5;
  uint uVar6;
  int n_blanks;
  void *pvVar7;
  char *texttype;
  toplevel_callback_fn_t p_Var8;
  PktIn *pktin;
  ptrlen pkt;
  uchar lenbuf [4];
  logblank_t blanks [4];
  
  iVar2 = *(int *)&bpp[-1].ic_in_raw.fn;
  if (iVar2 == 0) goto LAB_0011d061;
  if (iVar2 == 0x4f) goto LAB_0011d068;
  if (iVar2 == 0x66) {
    p_Var8 = bpp[-1].ic_out_pq.fn;
    while (_Var5 = bufchain_try_fetch_consume(bpp->in_raw,p_Var8,(size_t)bpp[-1].ic_in_raw.ctx),
          _Var5) {
      ssh_check_frozen(bpp->ssh);
      p_Var8 = bpp[-1].ic_out_pq.fn;
      pktin = *(PktIn **)&bpp[-1].remote_bugs;
      bVar1 = (byte)*p_Var8;
      pktin->type = (uint)bVar1;
      pkt.ptr = p_Var8 + 1;
      bpp[-1].ic_out_pq.fn = pkt.ptr;
      pkt.len = (void *)((long)bpp[-1].ic_in_raw.ctx - 1);
      bpp[-1].ic_in_raw.ctx = pkt.len;
      pktin->binarysource_[0].pos = 0;
      pktin->binarysource_[0].err = BSE_NO_ERROR;
      pktin->binarysource_[0].data = pkt.ptr;
      pktin->binarysource_[0].len = (size_t)pkt.len;
      pktin->binarysource_[0].binarysource_ = pktin->binarysource_;
      if (bVar1 == 7) {
        ssh_proto_error(bpp->ssh,"Remote side sent SSH2_MSG_EXT_INFO in bare connection protocol");
        return;
      }
      if (bpp->logctx != (LogContext *)0x0) {
        n_blanks = ssh2_censor_packet(bpp->pls,(uint)bVar1,false,pkt,blanks);
        ctx = bpp->logctx;
        iVar2 = **(int **)&bpp[-1].remote_bugs;
        texttype = ssh2_pkt_type(bpp->pls->kctx,bpp->pls->actx,iVar2);
        lVar3 = *(long *)&bpp[-1].remote_bugs;
        log_packet(ctx,0,iVar2,texttype,(void *)(*(long *)(lVar3 + 0x30) + *(long *)(lVar3 + 0x38)),
                   *(long *)(lVar3 + 0x40) - *(long *)(lVar3 + 0x38),n_blanks,blanks,
                   (unsigned_long *)(lVar3 + 8),0,(char *)0x0);
        pktin = *(PktIn **)&bpp[-1].remote_bugs;
      }
      _Var5 = ssh2_bpp_check_unimplemented(bpp,pktin);
      pvVar4 = *(void **)&bpp[-1].remote_bugs;
      if (_Var5) {
        safefree(pvVar4);
      }
      else {
        *(long *)((long)pvVar4 + 0x20) =
             *(long *)((long)pvVar4 + 0x40) - *(long *)((long)pvVar4 + 0x38);
        pq_base_push(&(bpp->in_pq).pqb,(PacketQueueNode *)((long)pvVar4 + 0x10));
      }
      bpp[-1].remote_bugs = 0;
      bpp[-1].ext_info_rsa_sha256_ok = false;
      bpp[-1].ext_info_rsa_sha512_ok = false;
      bpp[-1].expect_close = false;
      bpp[-1].field_0xdf = 0;
LAB_0011d061:
      *(undefined4 *)&bpp[-1].ic_in_raw.fn = 0x4f;
LAB_0011d068:
      _Var5 = bufchain_try_fetch_consume(bpp->in_raw,lenbuf,4);
      if (!_Var5) break;
      ssh_check_frozen(bpp->ssh);
      uVar6 = (uint)lenbuf >> 0x18 | ((uint)lenbuf & 0xff0000) >> 8 | ((uint)lenbuf & 0xff00) << 8 |
              (int)lenbuf << 0x18;
      bpp[-1].ic_in_raw.ctx = (void *)(long)(int)uVar6;
      if (uVar6 - 0x9000 < 0xffff7001) {
        ssh_sw_abort(bpp->ssh,"Invalid packet length received");
        goto LAB_0011d22b;
      }
      pvVar7 = safemalloc(1,0x58,(size_t)(long)(int)uVar6);
      *(void **)&bpp[-1].remote_bugs = pvVar7;
      *(undefined1 *)((long)pvVar7 + 0x28) = 0;
      *(undefined8 *)((long)pvVar7 + 0x10) = 0;
      *(undefined8 *)((long)pvVar7 + 0x18) = 0;
      *(undefined8 *)&bpp[-1].ic_in_raw.queued = 0;
      p_Var8 = (toplevel_callback_fn_t)((long)pvVar7 + 0x58);
      bpp[-1].ic_out_pq.fn = p_Var8;
      pvVar4 = bpp[-1].ic_out_pq.ctx;
      bpp[-1].ic_out_pq.ctx = (void *)((long)pvVar4 + 1);
      *(void **)((long)pvVar7 + 8) = pvVar4;
      *(undefined4 *)&bpp[-1].ic_in_raw.fn = 0x66;
    }
    if (bpp->input_eof != false) {
      if (bpp->expect_close == false) {
        ssh_remote_error(bpp->ssh,"Remote side unexpectedly closed network connection");
      }
      else {
        ssh_remote_eof(bpp->ssh,"Remote side closed network connection");
      }
    }
  }
  else {
LAB_0011d22b:
    *(undefined4 *)&bpp[-1].ic_in_raw.fn = 0;
  }
  return;
}

Assistant:

static void ssh2_bare_bpp_handle_input(BinaryPacketProtocol *bpp)
{
    struct ssh2_bare_bpp_state *s =
        container_of(bpp, struct ssh2_bare_bpp_state, bpp);

    crBegin(s->crState);

    while (1) {
        /* Read the length field. */
        {
            unsigned char lenbuf[4];
            BPP_READ(lenbuf, 4);
            s->packetlen = toint(GET_32BIT_MSB_FIRST(lenbuf));
        }

        if (s->packetlen <= 0 || s->packetlen >= (long)OUR_V2_PACKETLIMIT) {
            ssh_sw_abort(s->bpp.ssh, "Invalid packet length received");
            crStopV;
        }

        /*
         * Allocate the packet to return, now we know its length.
         */
        s->pktin = snew_plus(PktIn, s->packetlen);
        s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
        s->pktin->qnode.on_free_queue = false;
        s->maxlen = 0;
        s->data = snew_plus_get_aux(s->pktin);

        s->pktin->sequence = s->incoming_sequence++;

        /*
         * Read the remainder of the packet.
         */
        BPP_READ(s->data, s->packetlen);

        /*
         * The data we just read is precisely the initial type byte
         * followed by the packet payload.
         */
        s->pktin->type = s->data[0];
        s->data++;
        s->packetlen--;
        BinarySource_INIT(s->pktin, s->data, s->packetlen);

        if (s->pktin->type == SSH2_MSG_EXT_INFO) {
            /*
             * Mild layer violation: EXT_INFO is not permitted in the
             * bare ssh-connection protocol. Faulting it here means
             * that ssh2_common_filter_queue doesn't receive it in the
             * first place unless it's legal to have sent it.
             */
            ssh_proto_error(s->bpp.ssh, "Remote side sent SSH2_MSG_EXT_INFO "
                            "in bare connection protocol");
            return;
        }

        /*
         * Log incoming packet, possibly omitting sensitive fields.
         */
        if (s->bpp.logctx) {
            logblank_t blanks[MAX_BLANKS];
            int nblanks = ssh2_censor_packet(
                s->bpp.pls, s->pktin->type, false,
                make_ptrlen(s->data, s->packetlen), blanks);
            log_packet(s->bpp.logctx, PKT_INCOMING, s->pktin->type,
                       ssh2_pkt_type(s->bpp.pls->kctx, s->bpp.pls->actx,
                                     s->pktin->type),
                       get_ptr(s->pktin), get_avail(s->pktin), nblanks, blanks,
                       &s->pktin->sequence, 0, NULL);
        }

        if (ssh2_bpp_check_unimplemented(&s->bpp, s->pktin)) {
            sfree(s->pktin);
            s->pktin = NULL;
            continue;
        }

        s->pktin->qnode.formal_size = get_avail(s->pktin);
        pq_push(&s->bpp.in_pq, s->pktin);
        s->pktin = NULL;
    }

  eof:
    if (!s->bpp.expect_close) {
        ssh_remote_error(s->bpp.ssh,
                         "Remote side unexpectedly closed network connection");
    } else {
        ssh_remote_eof(s->bpp.ssh, "Remote side closed network connection");
    }
    return;  /* avoid touching s now it's been freed */

    crFinishV;
}